

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSplineLoader.cpp
# Opt level: O2

void __thiscall
COLLADASaxFWL::SplineLoader::SplineLoader
          (SplineLoader *this,IFilePartLoader *callingFilePartLoader,String *geometryId,
          String *geometryName)

{
  Spline *pSVar1;
  string *this_00;
  string local_70 [32];
  string local_50 [32];
  
  SourceArrayLoader::SourceArrayLoader(&this->super_SourceArrayLoader,callingFilePartLoader);
  (this->super_SourceArrayLoader).super_FilePartLoader.super_IFilePartLoader.super_ExtraDataLoader.
  _vptr_ExtraDataLoader = (_func_int **)&PTR__SplineLoader_0095f890;
  IFilePartLoader::createUniqueIdFromId
            (&this->mSplineUniqueId,(IFilePartLoader *)this,(geometryId->_M_dataplus)._M_p,GEOMETRY)
  ;
  pSVar1 = (Spline *)operator_new(0x220);
  COLLADAFW::Spline::Spline(pSVar1,&this->mSplineUniqueId);
  this->mSpline = pSVar1;
  (this->mInterpolations).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->mInterpolations;
  (this->mInterpolations).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->mInterpolations;
  (this->mInterpolations).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  Vertices::Vertices(&this->mVerticesInputs);
  this->mCurrentVertexInput = (InputUnshared *)0x0;
  this->mInVertices = false;
  this->mInSpline = true;
  if (geometryName->_M_string_length == 0) {
    if (geometryId->_M_string_length == 0) goto LAB_007de920;
    pSVar1 = this->mSpline;
    this_00 = local_70;
    std::__cxx11::string::string(this_00,(string *)geometryId);
    std::__cxx11::string::_M_assign((string *)&(pSVar1->super_Geometry).mName);
  }
  else {
    pSVar1 = this->mSpline;
    this_00 = local_50;
    std::__cxx11::string::string(this_00,(string *)geometryName);
    std::__cxx11::string::_M_assign((string *)&(pSVar1->super_Geometry).mName);
  }
  std::__cxx11::string::~string(this_00);
LAB_007de920:
  if (geometryId->_M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&(this->mSpline->super_Geometry).mOriginalId);
  }
  return;
}

Assistant:

SplineLoader::SplineLoader( IFilePartLoader* callingFilePartLoader, const String& geometryId, const String& geometryName )
		: SourceArrayLoader (callingFilePartLoader )
		, mSplineUniqueId(createUniqueIdFromId((ParserChar*)geometryId.c_str(), COLLADAFW::Geometry::ID()))
		, mSpline ( new COLLADAFW::Spline(mSplineUniqueId) )
        , mInterpolations()
        , mVerticesInputs()
        , mCurrentVertexInput( 0 )
        , mInVertices ( false )
        , mInSpline (true)
	{
        if ( !geometryName.empty() )
            mSpline->setName ( geometryName );
        else if ( !geometryId.empty() )
            mSpline->setName ( geometryId );

        if ( !geometryId.empty() )
            mSpline->setOriginalId ( geometryId );
	}